

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_save_generated_speech(HTS_Engine *engine,FILE *fp)

{
  ulong uVar1;
  size_t sVar2;
  FILE *in_RSI;
  long in_RDI;
  HTS_GStreamSet *gss;
  short temp;
  double x;
  size_t i;
  undefined2 local_22;
  double local_20;
  ulong local_18;
  FILE *local_10;
  
  local_10 = in_RSI;
  for (local_18 = 0; uVar1 = local_18,
      sVar2 = HTS_GStreamSet_get_total_nsamples((HTS_GStreamSet *)(in_RDI + 0x180)), uVar1 < sVar2;
      local_18 = local_18 + 1) {
    local_20 = HTS_GStreamSet_get_speech((HTS_GStreamSet *)(in_RDI + 0x180),local_18);
    if (local_20 <= 32767.0) {
      if (-32768.0 <= local_20) {
        local_22 = (undefined2)(int)local_20;
      }
      else {
        local_22 = 0x8000;
      }
    }
    else {
      local_22 = 0x7fff;
    }
    fwrite(&local_22,2,1,local_10);
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_speech(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      fwrite(&temp, sizeof(short), 1, fp);
   }
}